

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O0

bool HPack::anon_unknown_0::read_bit_pattern(BitPattern pattern,BitIStream *inputStream)

{
  quint64 qVar1;
  BitIStream *in_RSI;
  undefined2 in_DI;
  long in_FS_OFFSET;
  BitIStream *unaff_retaddr;
  quint64 in_stack_00000018;
  quint32 bitsRead;
  uchar chunk;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined4 in_stack_fffffffffffffff0;
  byte bVar2;
  byte bVar3;
  undefined1 in_stack_fffffffffffffff6;
  bool bVar4;
  byte bVar5;
  quint64 from;
  
  from = *(quint64 *)(in_FS_OFFSET + 0x28);
  bVar2 = (byte)in_DI;
  bVar3 = (byte)((ushort)in_DI >> 8);
  bVar5 = 0;
  BitIStream::streamOffset(in_RSI);
  qVar1 = BitIStream::peekBits<unsigned_char>
                    (unaff_retaddr,from,in_stack_00000018,
                     (uchar *)CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffffff6,
                                                      CONCAT15(bVar3,CONCAT14(bVar2,
                                                  in_stack_fffffffffffffff0)))));
  if ((uint)qVar1 == (uint)bVar3) {
    if (((int)(uint)bVar5 >> (8U - (char)qVar1 & 0x1f) & 0xffU) == (uint)bVar2) {
      BitIStream::skipBits(in_RSI,CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  }
  else {
    bVar4 = false;
  }
  if (*(quint64 *)(in_FS_OFFSET + 0x28) == from) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool read_bit_pattern(BitPattern pattern, BitIStream &inputStream)
{
    uchar chunk = 0;

    const quint32 bitsRead = inputStream.peekBits(inputStream.streamOffset(),
                                                  pattern.bitLength, &chunk);
    if (bitsRead != pattern.bitLength)
        return false;

    // Since peekBits packs in the most significant bits, shift it!
    chunk >>= (8 - bitsRead);
    if (chunk != pattern.value)
        return false;

    inputStream.skipBits(pattern.bitLength);

    return true;
}